

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O3

bool wallet::VerifyWallets(WalletContext *context)

{
  ArgsManager *this;
  string_view source_file;
  string arg;
  UniValue val;
  undefined1 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  ArgsManager **ppAVar5;
  Logger *pLVar6;
  bilingual_str *fmt;
  char *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  UniValue *this_01;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  pair<std::_Rb_tree_iterator<fs::path>,_bool> pVar8;
  DatabaseStatus status;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_paths;
  SettingsValue wallets;
  path wallet_dir;
  string log_msg;
  DatabaseStatus status_1;
  error_code error;
  undefined8 in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined8 in_stack_fffffffffffffd38;
  Chain *pCVar9;
  ArgsManager *args;
  undefined8 in_stack_fffffffffffffd50;
  UniValue *pUVar10;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  _Alloc_hider in_stack_fffffffffffffd68;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined1 local_278 [40];
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _List local_230;
  size_t local_228;
  UniValue local_220;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [9];
  undefined4 local_1af;
  undefined2 local_1ab;
  char local_1a9;
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [16];
  undefined1 local_180 [16];
  undefined3 local_170;
  undefined5 uStack_16d;
  vector<UniValue,_std::allocator<UniValue>_> vStack_168;
  undefined1 local_148 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [24];
  undefined1 local_f0 [8];
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  int64_t local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  path local_a0;
  undefined1 local_78 [36];
  undefined4 uStack_54;
  UniValue *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar9 = context->chain;
  this_00 = "VerifyWallets";
  ppAVar5 = inline_assertion_check<true,ArgsManager*&>
                      (&context->args,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
                       ,0x1e,"VerifyWallets","context.args");
  this = *ppAVar5;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-walletdir","");
  bVar3 = ArgsManager::IsArgSet(this,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar3) {
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-walletdir","");
    this_00 = local_1a8;
    local_1a8._16_8_ = 0;
    auStack_190[0] = '\0';
    auStack_190._1_7_ = 0;
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    auStack_190[8] = '\0';
    auStack_190._9_4_ = 0;
    auStack_190._13_2_ = 0;
    auStack_190[0xf] = '\0';
    std::filesystem::__cxx11::path::path((path *)this_00);
    arg._M_string_length = (size_type)in_stack_fffffffffffffd20;
    arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
    arg.field_2._M_allocated_capacity = in_stack_fffffffffffffd28;
    arg.field_2._8_4_ = in_stack_fffffffffffffd30;
    arg.field_2._12_4_ = in_stack_fffffffffffffd34;
    ArgsManager::GetPathArg((path *)local_148,this,arg,(path *)local_78);
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    local_78._32_4_ = 0;
    local_50 = (UniValue *)std::_V2::system_category();
    std::filesystem::canonical(&local_a0,(error_code *)local_148);
    std::filesystem::__cxx11::path::path((path *)local_250,(path *)&local_a0);
    std::filesystem::__cxx11::path::~path((path *)&local_a0);
    if (((local_78._32_4_ == 0) && (cVar4 = std::filesystem::status((path *)local_250), cVar4 != -1)
        ) && (cVar4 != '\0')) {
      cVar4 = std::filesystem::status((path *)local_250);
      if (cVar4 == '\x02') {
        cVar4 = std::filesystem::__cxx11::path::has_root_directory();
        if (cVar4 != '\0') {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-walletdir","");
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,local_250._0_8_,
                     (char *)(local_250._0_8_ + CONCAT44(local_250._12_4_,local_250._8_4_)));
          ArgsManager::ForceSetArg(this,(string *)local_1a8,(string *)local_108);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          std::filesystem::__cxx11::path::~path((path *)local_250);
          std::filesystem::__cxx11::path::~path((path *)local_148);
          goto LAB_004b5b98;
        }
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Specified -walletdir \"%s\" is a relative path","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_e8._0_8_ = &local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e8,"Specified -walletdir \"%s\" is a relative path","");
        }
        else {
          local_278._0_8_ = "Specified -walletdir \"%s\" is a relative path";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_278);
        }
        local_278._0_8_ = local_278 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,local_148._0_8_,
                   (error_category *)(local_148._8_8_ + local_148._0_8_));
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_1a8,(tinyformat *)local_108,(bilingual_str *)local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        (*pCVar9->_vptr_Chain[0x27])(pCVar9,local_1a8);
      }
      else {
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Specified -walletdir \"%s\" is not a directory","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_e8._0_8_ = &local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e8,"Specified -walletdir \"%s\" is not a directory","");
        }
        else {
          local_278._0_8_ = "Specified -walletdir \"%s\" is not a directory";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_278);
        }
        local_278._0_8_ = local_278 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,local_148._0_8_,
                   (error_category *)(local_148._8_8_ + local_148._0_8_));
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_1a8,(tinyformat *)local_108,(bilingual_str *)local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        (*pCVar9->_vptr_Chain[0x27])(pCVar9,local_1a8);
      }
    }
    else {
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Specified -walletdir \"%s\" does not exist","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_e8._0_8_ = &local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,"Specified -walletdir \"%s\" does not exist","");
      }
      else {
        local_278._0_8_ = "Specified -walletdir \"%s\" does not exist";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_278);
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,local_148._0_8_,
                 (error_category *)(local_148._8_8_ + local_148._0_8_));
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)local_1a8,(tinyformat *)local_108,(bilingual_str *)local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      (*pCVar9->_vptr_Chain[0x27])(pCVar9,local_1a8);
    }
    puVar1 = (undefined1 *)
             CONCAT17(auStack_190[0xf],
                      CONCAT25(auStack_190._13_2_,CONCAT41(auStack_190._9_4_,auStack_190[8])));
    if (puVar1 != local_180 + 8) {
      operator_delete(puVar1,(ulong)(local_180._8_8_ + 1));
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_,
                      CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_250);
    std::filesystem::__cxx11::path::~path((path *)local_148);
    bVar3 = false;
  }
  else {
LAB_004b5b98:
    GetWalletDir();
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,local_1a8._0_8_,(pointer)(local_1a8._8_8_ + local_1a8._0_8_));
    pLVar6 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar6);
    args = this;
    if (bVar3) {
      local_108._8_8_ = 0;
      local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
      local_108._0_8_ = local_108 + 0x10;
      tinyformat::format<std::__cxx11::string>
                ((string *)local_148,(tinyformat *)"Using wallet directory %s\n",(char *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      pLVar6 = LogInstance();
      local_148._0_8_ = (long *)0x58;
      local_148._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
      ;
      in_stack_fffffffffffffd18 = 0x58;
      in_stack_fffffffffffffd20 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
      ;
      in_stack_fffffffffffffd30 = 2;
      in_stack_fffffffffffffd28 = 0xffffffffffffffff;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/load.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = (char *)local_108._0_8_;
      str._M_len = local_108._8_8_;
      logging_function._M_str = "VerifyWallets";
      logging_function._M_len = 0xd;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x35,ALL,Info);
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,anon_var_dwarf_19429d1,anon_var_dwarf_19429d1 + 0x16);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_190 + 8);
    puVar1 = local_180 + 8;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      auStack_190[8] = SUB81(puVar1,0);
      auStack_190._9_4_ = (undefined4)((ulong)puVar1 >> 8);
      auStack_190._13_2_ = (undefined2)((ulong)puVar1 >> 0x28);
      auStack_190[0xf] = (undefined1)((ulong)puVar1 >> 0x38);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)pbVar7,anon_var_dwarf_19429d1,anon_var_dwarf_19429d1 + 0x16);
    }
    else {
      local_108._0_8_ = anon_var_dwarf_19429d1;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (pbVar7,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_108);
    }
    (*pCVar9->_vptr_Chain[0x25])(pCVar9,pbVar7);
    puVar1 = (undefined1 *)
             CONCAT17(auStack_190[0xf],
                      CONCAT25(auStack_190._13_2_,CONCAT41(auStack_190._9_4_,auStack_190[8])));
    if (puVar1 != local_180 + 8) {
      operator_delete(puVar1,(ulong)(local_180._8_8_ + 1));
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"wallet","");
    bVar3 = ArgsManager::IsArgSet(this,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar3) {
      local_108._0_8_ = local_108._0_8_ & 0xffffffffffff0000;
      local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
      local_108._16_8_ = 0;
      local_e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
      local_d8._8_2_ = 1;
      local_d8._M_local_buf[10] = '\0';
      local_c8 = 100;
      local_f0 = (undefined1  [8])(local_e8 + 8);
      ReadDatabaseArgs(this,(DatabaseOptions *)local_108);
      local_148._0_8_ = local_148 + 0x10;
      local_148._8_8_ = (error_category *)0x0;
      local_148[0x10] = '\0';
      local_120 = 0;
      local_118._M_local_buf[0] = '\0';
      local_108[0] = 1;
      local_d8._8_2_ = local_d8._8_2_ & 0xff00;
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_128._M_head_impl = (_Impl *)&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
      MakeWalletDatabase((wallet *)local_250,(string *)local_1a8,(DatabaseOptions *)local_108,
                         (DatabaseStatus *)local_278,(bilingual_str *)local_148);
      uVar2 = local_250._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_250._0_8_ + 8))(local_250._0_8_);
      }
      local_250._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_1c8 = local_1b8;
        local_1a8._0_4_ = 2;
        auStack_190[0] = '\0';
        auStack_190._1_7_ = (undefined7)local_1b8._1_8_;
        auStack_190[8] = SUB81(local_1b8._1_8_,7);
        auStack_190._9_4_ = local_1af;
        auStack_190._13_2_ = local_1ab;
        auStack_190[0xf] = local_1a9;
        local_1a8._16_8_ = 0;
        local_1c0 = 0;
        local_1b8[0] = 0;
        local_180._0_8_ = (pointer)0x0;
        local_180._8_8_ = (pointer)0x0;
        _local_170 = (pointer)0x0;
        vStack_168.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_168.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_168.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8._8_8_ = auStack_190;
        ::UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_220,(char (*) [1])0x896a96);
        val.val._M_dataplus._M_p = in_stack_fffffffffffffd20;
        val._0_8_ = in_stack_fffffffffffffd18;
        val.val._M_string_length = in_stack_fffffffffffffd28;
        val.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd30;
        val.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffd34;
        val.val.field_2._8_8_ = in_stack_fffffffffffffd38;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar9;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)args;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd50;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd58;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd60;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd68._M_p;
        ::UniValue::push_back((UniValue *)local_1a8,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_220.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_220.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.val._M_dataplus._M_p != &local_220.val.field_2) {
          operator_delete(local_220.val._M_dataplus._M_p,
                          local_220.val.field_2._M_allocated_capacity + 1);
        }
        local_250._0_8_ = &local_240;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"wallet","");
        (*pCVar9->_vptr_Chain[0x32])(pCVar9,local_250,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._0_8_ != &local_240) {
          operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_168);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_180);
        if ((undefined1 *)local_1a8._8_8_ != auStack_190) {
          operator_delete((void *)local_1a8._8_8_,CONCAT71(auStack_190._1_7_,auStack_190[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_head_impl != &local_118) {
        operator_delete(local_128._M_head_impl,
                        CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
        _GLOBAL__N_1::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
                  ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)local_f0,
                   local_e8._8_8_);
      }
    }
    local_240._8_8_ = (long)local_250 + 8;
    local_250._8_4_ = 0;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_240._M_allocated_capacity = 0;
    local_228 = 0;
    local_1a8._0_8_ = local_1a8 + 0x10;
    local_230._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )local_240._8_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"wallet","");
    (*pCVar9->_vptr_Chain[0x2f])(local_78 + 0x20,pCVar9,local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    this_01 = (UniValue *)CONCAT44(uStack_54,local_78._32_4_);
    if (this_01 != local_50) {
      pUVar10 = local_50;
      do {
        if (this_01->typ != VSTR) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "Invalid value detected for \'-wallet\' or \'-nowallet\'. \'-wallet\' requires a string value, while \'-nowallet\' accepts only \'1\' to disable all wallets"
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            puVar1 = local_180 + 8;
            auStack_190[8] = SUB81(puVar1,0);
            auStack_190._9_4_ = (undefined4)((ulong)puVar1 >> 8);
            auStack_190._13_2_ = (undefined2)((ulong)puVar1 >> 0x28);
            auStack_190[0xf] = (undefined1)((ulong)puVar1 >> 0x38);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(auStack_190 + 8),
                       "Invalid value detected for \'-wallet\' or \'-nowallet\'. \'-wallet\' requires a string value, while \'-nowallet\' accepts only \'1\' to disable all wallets"
                       ,"");
          }
          else {
            local_108._0_8_ =
                 "Invalid value detected for \'-wallet\' or \'-nowallet\'. \'-wallet\' requires a string value, while \'-nowallet\' accepts only \'1\' to disable all wallets"
            ;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (auStack_190 + 8),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)local_108);
          }
          (*pCVar9->_vptr_Chain[0x27])(pCVar9,local_1a8);
          puVar1 = (undefined1 *)
                   CONCAT17(auStack_190[0xf],
                            CONCAT25(auStack_190._13_2_,CONCAT41(auStack_190._9_4_,auStack_190[8])))
          ;
          if (puVar1 != local_180 + 8) {
            operator_delete(puVar1,(ulong)(local_180._8_8_ + 1));
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
LAB_004b6788:
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                    ((vector<UniValue,_std::allocator<UniValue>_> *)(local_78 + 0x20));
          bVar3 = false;
          goto LAB_004b6797;
        }
        fmt = (bilingual_str *)::UniValue::get_str_abi_cxx11_(this_01);
        GetWalletDir();
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt,
                   auto_format);
        std::filesystem::__cxx11::path::path((path *)local_148,(path *)local_1a8);
        std::filesystem::__cxx11::path::~path((path *)local_1a8);
        fsbridge::AbsPathJoin((path *)local_278,(path *)local_108,(path *)local_148);
        std::filesystem::__cxx11::path::~path((path *)local_148);
        std::filesystem::__cxx11::path::~path((path *)local_108);
        pVar8 = std::
                _Rb_tree<fs::path,fs::path,std::_Identity<fs::path>,std::less<fs::path>,std::allocator<fs::path>>
                ::_M_insert_unique<fs::path_const&>
                          ((_Rb_tree<fs::path,fs::path,std::_Identity<fs::path>,std::less<fs::path>,std::allocator<fs::path>>
                            *)local_250,(path *)local_278);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"Ignoring duplicate -wallet %s.","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_e8._0_8_ = &local_d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e8,"Ignoring duplicate -wallet %s.","");
          }
          else {
            local_148._0_8_ = "Ignoring duplicate -wallet %s.";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_148);
          }
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)local_1a8,(tinyformat *)local_108,fmt,pbVar7);
          (*pCVar9->_vptr_Chain[0x26])(pCVar9,(DatabaseOptions *)local_1a8);
          puVar1 = (undefined1 *)
                   CONCAT17(auStack_190[0xf],
                            CONCAT25(auStack_190._13_2_,CONCAT41(auStack_190._9_4_,auStack_190[8])))
          ;
          if (puVar1 != local_180 + 8) {
            operator_delete(puVar1,(ulong)(local_180._8_8_ + 1));
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ != &local_d8) {
            operator_delete((void *)local_e8._0_8_,
                            CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                            + 1);
          }
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          std::filesystem::__cxx11::path::~path((path *)local_278);
        }
        else {
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffff0000;
          local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
          local_1a8._16_8_ = 0;
          auStack_190[0] = SUB81(local_180,0);
          auStack_190._1_7_ = (undefined7)((ulong)local_180 >> 8);
          auStack_190[8] = '\0';
          auStack_190._9_4_ = 0;
          auStack_190._13_2_ = 0;
          auStack_190[0xf] = '\0';
          local_180._0_8_ = local_180._0_8_ & 0xffffffffffffff00;
          local_170 = 1;
          vStack_168.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x64;
          ReadDatabaseArgs(args,(DatabaseOptions *)local_1a8);
          local_1a8[0] = 1;
          local_170._0_1_ = 1;
          local_108._0_8_ = local_108 + 0x10;
          local_108._8_8_ = 0;
          local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
          local_e8._0_8_ = &local_d8;
          local_e8._8_8_ = 0;
          local_d8._M_local_buf[0] = '\0';
          pbVar7 = &local_c0;
          MakeWalletDatabase((wallet *)local_148,(string *)fmt,(DatabaseOptions *)local_1a8,
                             (DatabaseStatus *)pbVar7,(bilingual_str *)local_108);
          if ((long *)local_148._0_8_ == (long *)0x0) {
            if ((int)local_c0._M_dataplus._M_p == 5) {
              tinyformat::format<std::__cxx11::string>
                        ((string *)&stack0xfffffffffffffd68,
                         (tinyformat *)"Skipping -wallet path that doesn\'t exist. %s",
                         (char *)local_108,pbVar7);
              local_148._0_8_ = local_148 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_148,in_stack_fffffffffffffd68._M_p,
                         in_stack_fffffffffffffd68._M_p + local_290);
              local_128._M_head_impl = (_Impl *)&local_118;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,in_stack_fffffffffffffd68._M_p,
                         in_stack_fffffffffffffd68._M_p + local_290);
              (*pCVar9->_vptr_Chain[0x26])(pCVar9,(path *)local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_head_impl != &local_118) {
                operator_delete(local_128._M_head_impl,
                                CONCAT71(local_118._M_allocated_capacity._1_7_,
                                         local_118._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                operator_delete((void *)local_148._0_8_,
                                CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffd68._M_p != &local_288) {
                operator_delete(in_stack_fffffffffffffd68._M_p,local_288._M_allocated_capacity + 1);
              }
              goto LAB_004b627e;
            }
            (*pCVar9->_vptr_Chain[0x27])(pCVar9,(bilingual_str *)local_108);
            bVar3 = false;
          }
          else {
            (**(code **)(*(long *)local_148._0_8_ + 8))();
LAB_004b627e:
            bVar3 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ != &local_d8) {
            operator_delete((void *)local_e8._0_8_,
                            CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                            + 1);
          }
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          if ((undefined1 *)CONCAT71(auStack_190._1_7_,auStack_190[0]) != local_180) {
            _GLOBAL__N_1::std::__cxx11::
            basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
                      ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
                       auStack_190,local_180._0_8_);
          }
          std::filesystem::__cxx11::path::~path((path *)local_278);
          if (!bVar3) goto LAB_004b6788;
        }
        this_01 = this_01 + 1;
      } while (this_01 != pUVar10);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)(local_78 + 0x20));
    bVar3 = true;
LAB_004b6797:
    std::
    _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
    ::~_Rb_tree((_Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                 *)local_250);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool VerifyWallets(WalletContext& context)
{
    interfaces::Chain& chain = *context.chain;
    ArgsManager& args = *Assert(context.args);

    if (args.IsArgSet("-walletdir")) {
        const fs::path wallet_dir{args.GetPathArg("-walletdir")};
        std::error_code error;
        // The canonical path cleans the path, preventing >1 Berkeley environment instances for the same directory
        // It also lets the fs::exists and fs::is_directory checks below pass on windows, since they return false
        // if a path has trailing slashes, and it strips trailing slashes.
        fs::path canonical_wallet_dir = fs::canonical(wallet_dir, error);
        if (error || !fs::exists(canonical_wallet_dir)) {
            chain.initError(strprintf(_("Specified -walletdir \"%s\" does not exist"), fs::PathToString(wallet_dir)));
            return false;
        } else if (!fs::is_directory(canonical_wallet_dir)) {
            chain.initError(strprintf(_("Specified -walletdir \"%s\" is not a directory"), fs::PathToString(wallet_dir)));
            return false;
        // The canonical path transforms relative paths into absolute ones, so we check the non-canonical version
        } else if (!wallet_dir.is_absolute()) {
            chain.initError(strprintf(_("Specified -walletdir \"%s\" is a relative path"), fs::PathToString(wallet_dir)));
            return false;
        }
        args.ForceSetArg("-walletdir", fs::PathToString(canonical_wallet_dir));
    }

    LogPrintf("Using wallet directory %s\n", fs::PathToString(GetWalletDir()));

    chain.initMessage(_("Verifying wallet(s)…").translated);

    // For backwards compatibility if an unnamed top level wallet exists in the
    // wallets directory, include it in the default list of wallets to load.
    if (!args.IsArgSet("wallet")) {
        DatabaseOptions options;
        DatabaseStatus status;
        ReadDatabaseArgs(args, options);
        bilingual_str error_string;
        options.require_existing = true;
        options.verify = false;
        if (MakeWalletDatabase("", options, status, error_string)) {
            common::SettingsValue wallets(common::SettingsValue::VARR);
            wallets.push_back(""); // Default wallet name is ""
            // Pass write=false because no need to write file and probably
            // better not to. If unnamed wallet needs to be added next startup
            // and the setting is empty, this code will just run again.
            chain.overwriteRwSetting("wallet", wallets, /*write=*/false);
        }
    }

    // Keep track of each wallet absolute path to detect duplicates.
    std::set<fs::path> wallet_paths;

    for (const auto& wallet : chain.getSettingsList("wallet")) {
        if (!wallet.isStr()) {
            chain.initError(_("Invalid value detected for '-wallet' or '-nowallet'. "
                              "'-wallet' requires a string value, while '-nowallet' accepts only '1' to disable all wallets"));
            return false;
        }
        const auto& wallet_file = wallet.get_str();
        const fs::path path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(wallet_file));

        if (!wallet_paths.insert(path).second) {
            chain.initWarning(strprintf(_("Ignoring duplicate -wallet %s."), wallet_file));
            continue;
        }

        DatabaseOptions options;
        DatabaseStatus status;
        ReadDatabaseArgs(args, options);
        options.require_existing = true;
        options.verify = true;
        bilingual_str error_string;
        if (!MakeWalletDatabase(wallet_file, options, status, error_string)) {
            if (status == DatabaseStatus::FAILED_NOT_FOUND) {
                chain.initWarning(Untranslated(strprintf("Skipping -wallet path that doesn't exist. %s", error_string.original)));
            } else {
                chain.initError(error_string);
                return false;
            }
        }
    }

    return true;
}